

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenElementSegmentRef
BinaryenAddActiveElementSegment
          (BinaryenModuleRef module,char *table,char *name,char **funcNames,
          BinaryenIndex numFuncNames,BinaryenExpressionRef offset)

{
  char *this;
  pointer pEVar1;
  Fatal *pFVar2;
  ElementSegment *pEVar3;
  string_view local_228;
  Builder local_218;
  RefFunc *local_210;
  Fatal local_208;
  string_view local_80;
  Function *local_70;
  Function *func;
  BinaryenIndex i;
  string_view local_58;
  BinaryenExpressionRef local_48;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> local_40;
  __single_object segment;
  BinaryenExpressionRef offset_local;
  BinaryenIndex numFuncNames_local;
  char **funcNames_local;
  char *name_local;
  char *table_local;
  BinaryenModuleRef module_local;
  
  local_48 = offset;
  segment._M_t.
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
         )offset;
  name_local = table;
  table_local = (char *)module;
  std::make_unique<wasm::ElementSegment,char_const*&,wasm::Expression*>
            ((char **)&local_40,(Expression **)&name_local);
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_40);
  wasm::Name::Name((Name *)&local_58,name);
  wasm::Named::setExplicitName(&pEVar1->super_Named,(Name)local_58);
  func._0_4_ = 0;
  while( true ) {
    this = table_local;
    if (numFuncNames <= (uint)func) {
      pEVar3 = wasm::Module::addElementSegment((Module *)table_local,&local_40);
      std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
                (&local_40);
      return pEVar3;
    }
    wasm::Name::Name((Name *)&local_80,funcNames[(uint)func]);
    local_70 = wasm::Module::getFunctionOrNull((Module *)this,(Name)local_80);
    if (local_70 == (Function *)0x0) break;
    pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(&local_40);
    wasm::Builder::Builder(&local_218,(Module *)table_local);
    wasm::Name::Name((Name *)&local_228,funcNames[(uint)func]);
    local_210 = wasm::Builder::makeRefFunc(&local_218,(Name)local_228,(HeapType)(local_70->type).id)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pEVar1->data,(value_type *)&local_210);
    func._0_4_ = (uint)func + 1;
  }
  wasm::Fatal::Fatal(&local_208);
  pFVar2 = wasm::Fatal::operator<<(&local_208,(char (*) [19])"invalid function \'");
  pFVar2 = wasm::Fatal::operator<<(pFVar2,funcNames + (uint)func);
  wasm::Fatal::operator<<(pFVar2,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal(&local_208);
}

Assistant:

BinaryenElementSegmentRef
BinaryenAddActiveElementSegment(BinaryenModuleRef module,
                                const char* table,
                                const char* name,
                                const char** funcNames,
                                BinaryenIndex numFuncNames,
                                BinaryenExpressionRef offset) {
  auto segment = std::make_unique<ElementSegment>(table, (Expression*)offset);
  segment->setExplicitName(name);
  for (BinaryenIndex i = 0; i < numFuncNames; i++) {
    auto* func = ((Module*)module)->getFunctionOrNull(funcNames[i]);
    if (func == nullptr) {
      Fatal() << "invalid function '" << funcNames[i] << "'.";
    }
    segment->data.push_back(
      Builder(*(Module*)module).makeRefFunc(funcNames[i], func->type));
  }
  return ((Module*)module)->addElementSegment(std::move(segment));
}